

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double dirichlet_mix_pdf(double *x,int comp_num,int elem_num,double *a,double *comp_weight)

{
  double *a_00;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double local_38;
  
  uVar1 = 0xffffffffffffffff;
  if (-1 < elem_num) {
    uVar1 = (ulong)(uint)elem_num << 3;
  }
  a_00 = (double *)operator_new__(uVar1);
  if (0 < comp_num) {
    dVar4 = 0.0;
    uVar1 = 0;
    do {
      dVar4 = dVar4 + comp_weight[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)comp_num != uVar1);
    if (0 < comp_num) {
      local_38 = 0.0;
      uVar1 = 0;
      uVar2 = 0;
      do {
        if (0 < elem_num) {
          memcpy(a_00,a + uVar1,(ulong)(uint)elem_num << 3);
        }
        dVar3 = dirichlet_pdf(x,elem_num,a_00);
        local_38 = local_38 + (dVar3 * comp_weight[uVar2]) / dVar4;
        uVar2 = uVar2 + 1;
        uVar1 = (ulong)(uint)((int)uVar1 + elem_num);
      } while ((uint)comp_num != uVar2);
      goto LAB_00199b04;
    }
  }
  local_38 = 0.0;
LAB_00199b04:
  operator_delete__(a_00);
  return local_38;
}

Assistant:

double dirichlet_mix_pdf ( double x[], int comp_num, int elem_num, double a[],
  double comp_weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_MIX_PDF evaluates a Dirichlet mixture PDF.
//
//  Discussion:
//
//    The PDF is a weighted sum of Dirichlet PDF's.  Each PDF is a
//    "component", with an associated weight.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X[ELEM_NUM], the argument of the PDF.
//
//    Input, int COMP_NUM, the number of components in the Dirichlet
//    mixture density, that is, the number of distinct Dirichlet PDF's
//    that are mixed together.
//
//    Input, int ELEM_NUM, the number of elements of an observation.
//
//    Input, double A[ELEM_NUM*COMP_NUM], the probabilities for
//    element ELEM_NUM in component COMP_NUM.
//    Each A[I,J] should be positive.
//
//    Input, double COMP_WEIGHT[COMP_NUM], the mixture weights of the densities.
//    These do not need to be normalized.  The weight of a given component is
//    the relative probability that that component will be used to generate
//    the sample.
//
//    Output, double DIRICHLET_MIX_PDF, the value of the PDF.
//
{
  double *a_vec;
  double comp_pdf;
  double comp_weight_sum;
  int i;
  int j;
  double pdf;

  a_vec = new double[elem_num];

  comp_weight_sum = 0.0;
  for ( j = 0; j < comp_num; j++ )
  {
    comp_weight_sum = comp_weight_sum + comp_weight[j];
  }

  pdf = 0.0;
  for ( j = 0; j < comp_num; j++ )
  {
    for ( i = 0; i < elem_num; i++ )
    {
      a_vec[i] = a[i+j*elem_num];
    }
    comp_pdf = dirichlet_pdf ( x, elem_num, a_vec );

    pdf = pdf + comp_weight[j] * comp_pdf / comp_weight_sum;
  }

  delete [] a_vec;

  return pdf;
}